

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relations.cpp
# Opt level: O0

Relations dg::vr::Relations::getAugmented(Relations rels)

{
  bool bVar1;
  const_iterator pvVar2;
  bitset<12UL> in_RDI;
  Type type;
  const_iterator __end2;
  const_iterator __begin2;
  array<dg::vr::Relations::Type,_12UL> *__range2;
  Relations augmented;
  undefined1 in_stack_ffffffffffffffcb;
  Type in_stack_ffffffffffffffcc;
  Type in_stack_ffffffffffffffd0;
  value_type vVar3;
  const_iterator local_20;
  
  local_20 = std::array<dg::vr::Relations::Type,_12UL>::begin
                       ((array<dg::vr::Relations::Type,_12UL> *)0x102b3b);
  pvVar2 = std::array<dg::vr::Relations::Type,_12UL>::end
                     ((array<dg::vr::Relations::Type,_12UL> *)0x102b4c);
  for (; local_20 != pvVar2; local_20 = local_20 + 1) {
    vVar3 = *local_20;
    bVar1 = has((Relations *)CONCAT44(vVar3,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc);
    if (bVar1) {
      bVar1 = has((Relations *)CONCAT44(vVar3,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc);
      if (bVar1) {
        getNonStrict(in_stack_ffffffffffffffd0);
        set((Relations *)CONCAT44(vVar3,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc,
            (bool)in_stack_ffffffffffffffcb);
      }
      else {
        getNonStrict(in_stack_ffffffffffffffd0);
        bVar1 = has((Relations *)CONCAT44(vVar3,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc
                   );
        if (bVar1) {
          set((Relations *)CONCAT44(vVar3,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc,
              (bool)in_stack_ffffffffffffffcb);
          eq((Relations *)0x102bea);
        }
      }
    }
  }
  return (Relations)in_RDI.super__Base_bitset<1UL>._M_w;
}

Assistant:

Relations Relations::getAugmented(Relations rels) {
    Relations augmented = rels;
    for (Relations::Type type : Relations::all) {
        if (!strict.has(type))
            continue;

        if (augmented.has(type)) {
            augmented.set(Relations::getNonStrict(type));
        } else if (augmented.has(Relations::getNonStrict(type))) {
            augmented.set(type);
            augmented.eq();
        }
    }
    return augmented;
}